

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O2

void __thiscall
SyncFixture_SyncToBadVersions_Test::~SyncFixture_SyncToBadVersions_Test
          (SyncFixture_SyncToBadVersions_Test *this)

{
  anon_unknown.dwarf_2f1133::SyncFixture::~SyncFixture(&this->super_SyncFixture);
  operator_delete(this,0x158);
  return;
}

Assistant:

TEST_F (SyncFixture, SyncToBadVersions) {
    check_for_error ([this] () { db_.sync (1); }, pstore::error_code::unknown_revision);

    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->add (t1, "a", "first value");
        t1.commit ();
    }
    db_.sync (1);
    {
        transaction_type t2 = begin (db_, lock_guard{mutex_});
        this->add (t2, "b", "second value");
        t2.commit ();
    }

    check_for_error ([this] () { db_.sync (3); }, pstore::error_code::unknown_revision);
}